

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

LabeledDataset * __thiscall
notch::core::LabeledDataset::append(LabeledDataset *this,Input *input,Output *output)

{
  size_t sVar1;
  size_t sVar2;
  undefined1 local_40 [8];
  Output output_copy;
  Input input_copy;
  Output *output_local;
  Input *input_local;
  LabeledDataset *this_local;
  
  if (this->nSamples == 0) {
    sVar2 = std::valarray<float>::size(input);
    this->inputDimension = sVar2;
    sVar2 = std::valarray<float>::size(output);
    this->outputDimension = sVar2;
  }
  else {
    sVar2 = this->inputDimension;
    sVar1 = std::valarray<float>::size(input);
    if (sVar2 != sVar1) {
      __assert_fail("inputDimension == input.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                    ,0xfc,
                    "LabeledDataset &notch::LabeledDataset::append(const Input &, const Output &)");
    }
    sVar2 = this->outputDimension;
    sVar1 = std::valarray<float>::size(output);
    if (sVar2 != sVar1) {
      __assert_fail("outputDimension == output.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                    ,0xfd,
                    "LabeledDataset &notch::LabeledDataset::append(const Input &, const Output &)");
    }
  }
  this->nSamples = this->nSamples + 1;
  std::valarray<float>::valarray((valarray<float> *)&output_copy._M_data,input);
  std::valarray<float>::valarray((valarray<float> *)local_40,output);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::push_back
            (&this->inputs,(value_type *)&output_copy._M_data);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::push_back
            (&this->outputs,(value_type *)local_40);
  std::valarray<float>::~valarray((valarray<float> *)local_40);
  std::valarray<float>::~valarray((valarray<float> *)&output_copy._M_data);
  return this;
}

Assistant:

LabeledDataset &append(const Input &input, const Output &output) {
        if (nSamples != 0) {
            assert(inputDimension == input.size());
            assert(outputDimension == output.size());
        } else {
            inputDimension = input.size();
            outputDimension = output.size();
        }
        nSamples++;
        Input input_copy(input);
        Output output_copy(output);
        inputs.push_back(input_copy);
        outputs.push_back(output_copy);
        return *this;
    }